

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O2

_Bool string_iterator(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_object_t *pgVar1;
  uint32_t uVar2;
  gravity_fiber_t *fiber;
  ulong uVar3;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar4;
  gravity_class_t *pgVar5;
  gravity_value_t value;
  gravity_value_t value_00;
  char _buffer [4096];
  char local_1028 [4096];
  
  uVar3 = (ulong)*(uint *)((long)&((args->field_1).p)->identifier + 4);
  pgVar5 = gravity_class_bool;
  if (uVar3 != 0) {
    pgVar1 = args[1].field_1.p;
    pgVar5 = gravity_class_int;
    if (gravity_class_null != args[1].isa || pgVar1 != (gravity_object_t *)0x0) {
      if (args[1].isa != gravity_class_int) {
        builtin_strncpy(local_1028,"Iterator expects a numeric value here.",0x27);
        fiber = gravity_vm_fiber(vm);
        gravity_fiber_seterror(fiber,local_1028);
        value.field_1.n = 0;
        value.isa = gravity_class_null;
        gravity_vm_setslot(vm,value,rindex);
        return false;
      }
      pgVar5 = gravity_class_bool;
      if ((long)((long)&pgVar1->isa + 1) < (long)uVar3) {
        uVar2 = utf8_charbytes((char *)((long)&pgVar1->isa +
                                       (long)&((args->field_1).p)->objclass->isa),0);
        aVar4.p = (gravity_object_t *)((long)&pgVar1->isa + (ulong)uVar2);
        pgVar5 = gravity_class_int;
        goto LAB_00128dab;
      }
    }
  }
  aVar4.n = 0;
LAB_00128dab:
  value_00.field_1.n = aVar4.n;
  value_00.isa = pgVar5;
  gravity_vm_setslot(vm,value_00,rindex);
  return true;
}

Assistant:

static bool string_iterator (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    #pragma unused(vm, nargs)
    gravity_string_t *string = VALUE_AS_STRING(GET_VALUE(0));

    // check for empty string first
    if (string->len == 0) RETURN_VALUE(VALUE_FROM_FALSE, rindex);

    // check for start of iteration
    if (VALUE_ISA_NULL(GET_VALUE(1))) RETURN_VALUE(VALUE_FROM_INT(0), rindex);

    // extract value
    gravity_value_t value = GET_VALUE(1);

    // check error condition
    if (!VALUE_ISA_INT(value)) RETURN_ERROR("Iterator expects a numeric value here.");

    // compute new value
    gravity_int_t index = value.n;
    if (index+1 < string->len) {
        uint32_t n = utf8_charbytes(string->s + index, 0);
        index += n;
    } else {
        RETURN_VALUE(VALUE_FROM_FALSE, rindex);
    }

    // return new iterator
    RETURN_VALUE(VALUE_FROM_INT(index), rindex);
}